

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

bool __thiscall Memory::Recycler::VerifyMark(Recycler *this,void *objectAddress,void *target)

{
  HeapBlock *pHVar1;
  int iVar2;
  HeapBlock *pHVar3;
  undefined4 extraout_var;
  
  if (this->enableScanInteriorPointers == true) {
    pHVar3 = HeapBlockMap64::GetHeapBlock(&this->heapBlockMap,target);
    if (pHVar3 == (HeapBlock *)0x0) {
      return false;
    }
    iVar2 = (*pHVar3->_vptr_HeapBlock[8])(pHVar3,target);
    target = (void *)CONCAT44(extraout_var,iVar2);
    pHVar1 = (HeapBlock *)target;
  }
  else if (((ulong)target & 0xf) == 0 && (void *)0xffff < target) {
    pHVar3 = HeapBlockMap64::GetHeapBlock(&this->heapBlockMap,target);
    pHVar1 = pHVar3;
  }
  else {
    pHVar3 = (HeapBlock *)0x0;
    pHVar1 = pHVar3;
  }
  if (pHVar1 == (HeapBlock *)0x0) {
    return false;
  }
  iVar2 = (*pHVar3->_vptr_HeapBlock[0xd])(pHVar3,objectAddress,target);
  return SUB41(iVar2,0);
}

Assistant:

bool
Recycler::VerifyMark(void * objectAddress, void * target)
{
    void * realAddress;
    HeapBlock * heapBlock;
    if (this->enableScanInteriorPointers)
    {
        heapBlock = heapBlockMap.GetHeapBlock(target);
        if (heapBlock == nullptr)
        {
            return false;
        }
        realAddress = heapBlock->GetRealAddressFromInterior(target);
        if (realAddress == nullptr)
        {
            return false;
        }
    }
    else
    {
        heapBlock = this->FindHeapBlock(target);
        if (heapBlock == nullptr)
        {
            return false;
        }
        realAddress = target;
    }
    return heapBlock->VerifyMark(objectAddress, realAddress);
}